

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
::remove_maximal_cell
          (RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
           *this,Index columnIndex)

{
  Index curr;
  
  for (; columnIndex < this->nextEventIndex_ - 1; columnIndex = columnIndex + 1) {
    RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
    ::vine_swap(&this->super_RU_vine_swap_option,columnIndex);
  }
  remove_last(this);
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::remove_maximal_cell(Index columnIndex)
{
  static_assert(Master_matrix::Option_list::has_removable_columns && Master_matrix::Option_list::has_vine_update,
                "'remove_maximal_cell' is not implemented for the chosen options.");

  // TODO: is there an easy test to verify maximality even without row access?

  for (Index curr = columnIndex; curr < nextEventIndex_ - 1; ++curr) {
    Swap_opt::vine_swap(curr);
  }

  remove_last();
}